

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O2

void Vec_MemHashAlloc(Vec_Mem_t *p,int nTableSize)

{
  int nCap;
  Vec_Int_t *pVVar1;
  
  if ((p->vTable == (Vec_Int_t *)0x0) && (p->vNexts == (Vec_Int_t *)0x0)) {
    nCap = Abc_PrimeCudd(nTableSize);
    pVVar1 = Vec_IntAlloc(nCap);
    pVVar1->nSize = nCap;
    if (pVVar1->pArray != (int *)0x0) {
      memset(pVVar1->pArray,0xff,(long)nCap << 2);
    }
    p->vTable = pVVar1;
    pVVar1 = Vec_IntAlloc(nTableSize);
    p->vNexts = pVVar1;
    return;
  }
  __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
}

Assistant:

static inline void Vec_MemHashAlloc( Vec_Mem_t * p, int nTableSize )
{
    assert( p->vTable == NULL && p->vNexts == NULL );
    p->vTable = Vec_IntStartFull( Abc_PrimeCudd(nTableSize) );
    p->vNexts = Vec_IntAlloc( nTableSize );
}